

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TextureGatherCase::
verify<tcu::Texture2DArrayView,tcu::Vector<float,3>>
          (TextureGatherCase *this,ConstPixelBufferAccess *rendered,Texture2DArrayView *texture,
          Vector<float,_3> (*texCoords) [4],GatherArgs *gatherArgs)

{
  GatherType gatherType;
  BVec4 BVar1;
  TestLog *pTVar2;
  bool bVar3;
  float *pfVar4;
  MessageBuilder *pMVar5;
  PixelOffsets *pPVar6;
  uint local_374;
  Vector<unsigned_int,_4> local_370;
  undefined1 local_360 [8];
  IntLookupPrecision lookupPrec_1;
  int iStack_32c;
  undefined1 local_320 [8];
  LookupPrecision lookupPrec;
  int componentNdx_1;
  undefined1 local_2d8 [8];
  TexComparePrecision comparePrec;
  Sampler sampler;
  IVec3 uvwBits;
  IVec3 coordBits;
  Vector<int,_4> local_250;
  Vector<int,_4> local_240;
  undefined1 local_230 [8];
  IVec4 colorBits;
  PixelFormat pixelFormat;
  undefined1 local_208 [8];
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
  pixelOffsets;
  MessageBuilder local_1e8;
  byte local_65;
  undefined1 local_64 [7];
  bool isOk;
  Vec4 refColor;
  Vec4 incompleteColor;
  int componentNdx;
  TestLog *log;
  GatherArgs *gatherArgs_local;
  Vector<float,_3> (*texCoords_local) [4];
  Texture2DArrayView *texture_local;
  ConstPixelBufferAccess *rendered_local;
  TextureGatherCase *this_local;
  
  register0x00000000 = tcu::TestContext::getLog(*(TestContext **)(this + 8));
  if ((*(uint *)(this + 0xb4) & 1) == 0) {
    gatherType = *(GatherType *)(this + 0x78);
    Functional::anon_unknown_0::TextureGatherCase::getOffsetRange
              ((TextureGatherCase *)&pixelFormat.blueBits);
    Functional::anon_unknown_0::makePixelOffsetsFunctor
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                *)local_208,gatherType,gatherArgs,(IVec2 *)&pixelFormat.blueBits);
    tcu::PixelFormat::PixelFormat((PixelFormat *)(colorBits.m_data + 2),8,8,8,8);
    glu::TextureTestUtil::getBitsVec
              ((TextureTestUtil *)&local_250,(PixelFormat *)(colorBits.m_data + 2));
    tcu::operator-((tcu *)&local_240,&local_250,1);
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(coordBits.m_data + 1),0);
    tcu::max<int,4>((tcu *)local_230,&local_240,(Vector<int,_4> *)(coordBits.m_data + 1));
    if (*(int *)(this + 0xb8) == 0) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),0x14,0x14,0);
    }
    else if (*(int *)(this + 0xb8) == 1) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),10,10,10);
    }
    else if (*(int *)(this + 0xb8) == 2) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),0x14,0x14,0x14);
    }
    else {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(uvwBits.m_data + 1),-1);
    }
    if (*(int *)(this + 0xb8) == 0) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,7,7,0);
    }
    else if (*(int *)(this + 0xb8) == 1) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,6,6,0);
    }
    else if (*(int *)(this + 0xb8) == 2) {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,7,7,7);
    }
    else {
      tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&sampler.seamlessCubeMap,-1);
    }
    tcu::Sampler::Sampler((Sampler *)&comparePrec.referenceBits);
    comparePrec.referenceBits = *(int *)(this + 0x8c);
    comparePrec.resultBits = *(int *)(this + 0x90);
    sampler.lodThreshold = *(float *)(this + 0x88);
    bVar3 = Functional::anon_unknown_0::isDepthFormat((TextureFormat *)(this + 0x80));
    if (bVar3) {
      tcu::TexComparePrecision::TexComparePrecision((TexComparePrecision *)local_2d8);
      pTVar2 = stack0xffffffffffffffc0;
      comparePrec.coordBits.m_data[0] = coordBits.m_data[0];
      local_2d8._0_4_ = uvwBits.m_data[1];
      local_2d8._4_4_ = uvwBits.m_data[2];
      comparePrec.uvwBits.m_data[0] = uvwBits.m_data[0];
      comparePrec.coordBits.m_data._4_8_ = sampler._52_8_;
      comparePrec.uvwBits.m_data[2] = 0x10;
      comparePrec.pcfBits = colorBits.m_data[2] + -1;
      Functional::anon_unknown_0::PixelCompareRefZDefault::PixelCompareRefZDefault
                ((PixelCompareRefZDefault *)&componentNdx_1,(IVec2 *)&RENDER_SIZE);
      pPVar6 = de::details::
               UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
               ::operator*((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                            *)local_208);
      this_local._7_1_ =
           verifyGatherOffsetsCompare<tcu::Texture2DArrayView,tcu::Vector<float,3>>
                     (pTVar2,rendered,texture,texCoords,(Sampler *)&comparePrec.referenceBits,
                      (TexComparePrecision *)local_2d8,(PixelCompareRefZ *)&componentNdx_1,pPVar6);
    }
    else {
      lookupPrec.colorMask.m_data = (bool  [4])de::max<int>(0,gatherArgs->componentNdx);
      bVar3 = Functional::anon_unknown_0::isUnormFormatType(*(ChannelType *)(this + 0x84));
      if (bVar3) {
        tcu::LookupPrecision::LookupPrecision((LookupPrecision *)local_320);
        tcu::computeFixedPointThreshold((tcu *)&lookupPrec_1.colorMask,(IVec4 *)local_230);
        lookupPrec.uvwBits.m_data[1]._0_1_ = lookupPrec_1.colorMask.m_data[0];
        lookupPrec.uvwBits.m_data[1]._1_1_ = lookupPrec_1.colorMask.m_data[1];
        lookupPrec.uvwBits.m_data[1]._2_1_ = lookupPrec_1.colorMask.m_data[2];
        lookupPrec.uvwBits.m_data[1]._3_1_ = lookupPrec_1.colorMask.m_data[3];
        lookupPrec.uvwBits.m_data[2] = iStack_32c;
        lookupPrec.coordBits.m_data[0] = coordBits.m_data[0];
        local_320._0_4_ = uvwBits.m_data[1];
        local_320._4_4_ = uvwBits.m_data[2];
        lookupPrec.uvwBits.m_data[0] = uvwBits.m_data[0];
        lookupPrec.coordBits.m_data._4_8_ = sampler._52_8_;
        glu::TextureTestUtil::getCompareMask
                  ((TextureTestUtil *)(lookupPrec_1.colorThreshold.m_data + 3),
                   (PixelFormat *)(colorBits.m_data + 2));
        pTVar2 = stack0xffffffffffffffc0;
        BVar1 = lookupPrec.colorMask;
        lookupPrec.colorThreshold.m_data[2] = (float)lookupPrec_1.colorThreshold.m_data[3];
        pPVar6 = de::details::
                 UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                 ::operator*((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                              *)local_208);
        this_local._7_1_ =
             verifyGatherOffsets<float,tcu::LookupPrecision,tcu::Texture2DArrayView,tcu::Vector<float,3>>
                       (pTVar2,rendered,texture,texCoords,(Sampler *)&comparePrec.referenceBits,
                        (LookupPrecision *)local_320,(int)BVar1.m_data,pPVar6);
      }
      else {
        bVar3 = Functional::anon_unknown_0::isUIntFormatType(*(ChannelType *)(this + 0x84));
        if ((bVar3) ||
           (bVar3 = Functional::anon_unknown_0::isSIntFormatType(*(ChannelType *)(this + 0x84)),
           bVar3)) {
          tcu::IntLookupPrecision::IntLookupPrecision((IntLookupPrecision *)local_360);
          tcu::Vector<unsigned_int,_4>::Vector(&local_370,0);
          lookupPrec_1.uvwBits.m_data[1] = local_370.m_data[0];
          lookupPrec_1.uvwBits.m_data[2] = local_370.m_data[1];
          lookupPrec_1.colorThreshold.m_data[0] = local_370.m_data[2];
          lookupPrec_1.colorThreshold.m_data[1] = local_370.m_data[3];
          lookupPrec_1.coordBits.m_data[0] = coordBits.m_data[0];
          local_360._0_4_ = uvwBits.m_data[1];
          local_360._4_4_ = uvwBits.m_data[2];
          lookupPrec_1.uvwBits.m_data[0] = uvwBits.m_data[0];
          lookupPrec_1.coordBits.m_data._4_8_ = sampler._52_8_;
          glu::TextureTestUtil::getCompareMask
                    ((TextureTestUtil *)&local_374,(PixelFormat *)(colorBits.m_data + 2));
          lookupPrec_1.colorThreshold.m_data[2] = local_374;
          bVar3 = Functional::anon_unknown_0::isUIntFormatType(*(ChannelType *)(this + 0x84));
          pTVar2 = stack0xffffffffffffffc0;
          BVar1 = lookupPrec.colorMask;
          if (bVar3) {
            pPVar6 = de::details::
                     UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                     ::operator*((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                                  *)local_208);
            this_local._7_1_ =
                 verifyGatherOffsets<unsigned_int,tcu::IntLookupPrecision,tcu::Texture2DArrayView,tcu::Vector<float,3>>
                           (pTVar2,rendered,texture,texCoords,(Sampler *)&comparePrec.referenceBits,
                            (IntLookupPrecision *)local_360,(int)BVar1.m_data,pPVar6);
          }
          else {
            bVar3 = Functional::anon_unknown_0::isSIntFormatType(*(ChannelType *)(this + 0x84));
            pTVar2 = stack0xffffffffffffffc0;
            BVar1 = lookupPrec.colorMask;
            if (bVar3) {
              pPVar6 = de::details::
                       UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                       ::operator*((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                                    *)local_208);
              this_local._7_1_ =
                   verifyGatherOffsets<int,tcu::IntLookupPrecision,tcu::Texture2DArrayView,tcu::Vector<float,3>>
                             (pTVar2,rendered,texture,texCoords,
                              (Sampler *)&comparePrec.referenceBits,(IntLookupPrecision *)local_360,
                              (int)BVar1.m_data,pPVar6);
            }
            else {
              this_local._7_1_ = false;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    de::details::
    MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
    ::~MovePtr((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::PixelOffsets>_>
                *)local_208);
  }
  else {
    incompleteColor.m_data[2] = (float)de::max<int>(0,gatherArgs->componentNdx);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(refColor.m_data + 2),0.0,0.0,0.0,1.0);
    pfVar4 = tcu::Vector<float,_4>::operator[]
                       ((Vector<float,_4> *)(refColor.m_data + 2),(int)incompleteColor.m_data[2]);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_64,*pfVar4);
    local_65 = Functional::anon_unknown_0::verifySingleColored
                         (stack0xffffffffffffffc0,rendered,(Vec4 *)local_64);
    if (!(bool)local_65) {
      tcu::TestLog::operator<<
                (&local_1e8,stack0xffffffffffffffc0,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1e8,(char (*) [22])"Note: expected color ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)local_64);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [18])" for all pixels; ");
      pfVar4 = tcu::Vector<float,_4>::operator[]
                         ((Vector<float,_4> *)(refColor.m_data + 2),(int)incompleteColor.m_data[2]);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,pfVar4);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [24])" is component at index ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)(incompleteColor.m_data + 2));
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])" in the color ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(Vector<float,_4> *)(refColor.m_data + 2));
      pMVar5 = tcu::MessageBuilder::operator<<
                         (pMVar5,(char (*) [40])", which is used for incomplete textures");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e8);
    }
    this_local._7_1_ = (bool)(local_65 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool TextureGatherCase::verify (const ConstPixelBufferAccess&	rendered,
								const TexViewT&					texture,
								const TexCoordT					(&texCoords)[4],
								const GatherArgs&				gatherArgs) const
{
	TestLog& log = m_testCtx.getLog();

	if (m_flags & GATHERCASE_MIPMAP_INCOMPLETE)
	{
		const int	componentNdx		= de::max(0, gatherArgs.componentNdx);
		const Vec4	incompleteColor		(0.0f, 0.0f, 0.0f, 1.0f);
		const Vec4	refColor			(incompleteColor[componentNdx]);
		const bool	isOk				= verifySingleColored(log, rendered, refColor);

		if (!isOk)
			log << TestLog::Message << "Note: expected color " << refColor << " for all pixels; "
									<< incompleteColor[componentNdx] << " is component at index " << componentNdx
									<< " in the color " << incompleteColor << ", which is used for incomplete textures" << TestLog::EndMessage;

		return isOk;
	}
	else
	{
		DE_ASSERT(m_colorBufferFormat.order == tcu::TextureFormat::RGBA);
		DE_ASSERT(m_colorBufferFormat.type == tcu::TextureFormat::UNORM_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::UNSIGNED_INT8		||
				  m_colorBufferFormat.type == tcu::TextureFormat::SIGNED_INT8);

		const MovePtr<PixelOffsets>		pixelOffsets	= makePixelOffsetsFunctor(m_gatherType, gatherArgs, getOffsetRange());
		const tcu::PixelFormat			pixelFormat		= tcu::PixelFormat(8,8,8,8);
		const IVec4						colorBits		= tcu::max(glu::TextureTestUtil::getBitsVec(pixelFormat) - 1, tcu::IVec4(0));
		const IVec3						coordBits		= m_textureType == TEXTURETYPE_2D			? IVec3(20,20,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(10,10,10)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(20,20,20)
														: IVec3(-1);
		const IVec3						uvwBits			= m_textureType == TEXTURETYPE_2D			? IVec3(7,7,0)
														: m_textureType == TEXTURETYPE_CUBE			? IVec3(6,6,0)
														: m_textureType == TEXTURETYPE_2D_ARRAY		? IVec3(7,7,7)
														: IVec3(-1);
		tcu::Sampler					sampler;
		sampler.wrapS		= m_wrapS;
		sampler.wrapT		= m_wrapT;
		sampler.compare		= m_shadowCompareMode;

		if (isDepthFormat(m_textureFormat))
		{
			tcu::TexComparePrecision comparePrec;
			comparePrec.coordBits		= coordBits;
			comparePrec.uvwBits			= uvwBits;
			comparePrec.referenceBits	= 16;
			comparePrec.resultBits		= pixelFormat.redBits-1;

			return verifyGatherOffsetsCompare(log, rendered, texture, texCoords, sampler, comparePrec, PixelCompareRefZDefault(RENDER_SIZE), *pixelOffsets);
		}
		else
		{
			const int componentNdx = de::max(0, gatherArgs.componentNdx);

			if (isUnormFormatType(m_textureFormat.type))
			{
				tcu::LookupPrecision lookupPrec;
				lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(colorBits);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);
				return verifyGatherOffsets<float>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
			}
			else if (isUIntFormatType(m_textureFormat.type) || isSIntFormatType(m_textureFormat.type))
			{
				tcu::IntLookupPrecision		lookupPrec;
				lookupPrec.colorThreshold	= UVec4(0);
				lookupPrec.coordBits		= coordBits;
				lookupPrec.uvwBits			= uvwBits;
				lookupPrec.colorMask		= glu::TextureTestUtil::getCompareMask(pixelFormat);

				if (isUIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deUint32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else if (isSIntFormatType(m_textureFormat.type))
					return verifyGatherOffsets<deInt32>(log, rendered, texture, texCoords, sampler, lookupPrec, componentNdx, *pixelOffsets);
				else
				{
					DE_ASSERT(false);
					return false;
				}
			}
			else
			{
				DE_ASSERT(false);
				return false;
			}
		}
	}
}